

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler_sse2.c
# Opt level: O2

void RescalerImportRowExpand_SSE2(WebPRescaler *wrk,uint8_t *src)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  short sVar6;
  short sVar7;
  ushort uVar8;
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [13];
  undefined1 auVar34 [13];
  undefined1 auVar35 [13];
  undefined1 auVar36 [13];
  undefined1 auVar37 [13];
  undefined1 auVar38 [13];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [13];
  undefined1 auVar50 [13];
  undefined1 auVar51 [13];
  unkuint9 Var52;
  undefined1 auVar53 [13];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [13];
  undefined1 auVar61 [13];
  undefined1 auVar62 [13];
  undefined1 auVar63 [13];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [13];
  undefined1 auVar67 [13];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  uint5 uVar72;
  rescaler_t *prVar73;
  undefined1 (*pauVar74) [16];
  int iVar75;
  ulong *puVar76;
  uint uVar77;
  uint uVar78;
  ulong uVar79;
  undefined1 auVar80 [16];
  undefined1 uVar82;
  byte bVar83;
  undefined1 uVar84;
  undefined1 uVar85;
  undefined1 auVar81 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  
  auVar81 = _DAT_00123d60;
  auVar80 = _DAT_00123d50;
  uVar2 = wrk->x_add;
  iVar3 = wrk->src_width;
  if (0x7fff < (int)uVar2 || (long)iVar3 < 8) {
    WebPRescalerImportRowExpand_C(wrk,src);
    return;
  }
  pauVar74 = (undefined1 (*) [16])wrk->frow;
  iVar4 = wrk->dst_width;
  iVar5 = wrk->num_channels;
  prVar73 = (rescaler_t *)*pauVar74;
  if (iVar5 != 4) {
    uVar79 = *(ulong *)src;
    auVar11._8_6_ = 0;
    auVar11._0_8_ = uVar79;
    auVar11[0xe] = (char)(uVar79 >> 0x38);
    auVar15._8_4_ = 0;
    auVar15._0_8_ = uVar79;
    auVar15[0xc] = (char)(uVar79 >> 0x30);
    auVar15._13_2_ = auVar11._13_2_;
    auVar19._8_4_ = 0;
    auVar19._0_8_ = uVar79;
    auVar19._12_3_ = auVar15._12_3_;
    auVar23._8_2_ = 0;
    auVar23._0_8_ = uVar79;
    auVar23[10] = (char)(uVar79 >> 0x28);
    auVar23._11_4_ = auVar19._11_4_;
    auVar27._8_2_ = 0;
    auVar27._0_8_ = uVar79;
    auVar27._10_5_ = auVar23._10_5_;
    auVar31[8] = (char)(uVar79 >> 0x20);
    auVar31._0_8_ = uVar79;
    auVar31._9_6_ = auVar27._9_6_;
    auVar64._7_8_ = 0;
    auVar64._0_7_ = auVar31._8_7_;
    auVar68._1_8_ = SUB158(auVar64 << 0x40,7);
    auVar68[0] = (char)(uVar79 >> 0x18);
    auVar68._9_6_ = 0;
    auVar69._1_10_ = SUB1510(auVar68 << 0x30,5);
    auVar69[0] = (char)(uVar79 >> 0x10);
    auVar69._11_4_ = 0;
    auVar39[2] = (char)(uVar79 >> 8);
    auVar39._0_2_ = (ushort)uVar79;
    auVar39._3_12_ = SUB1512(auVar69 << 0x20,3);
    auVar80._0_2_ = (ushort)uVar79 & 0xff;
    auVar80._2_13_ = auVar39._2_13_;
    auVar80[0xf] = 0;
    puVar76 = (ulong *)(src + 7);
    iVar75 = 7;
    uVar77 = uVar2;
    while( true ) {
      auVar81 = pmaddwd(ZEXT416((uVar2 - uVar77) * 0x10000 | uVar77),auVar80);
      *(rescaler_t *)*pauVar74 = auVar81._0_4_;
      pauVar74 = (undefined1 (*) [16])((long)*pauVar74 + 4);
      if ((undefined1 (*) [16])(prVar73 + (long)iVar4 * (long)iVar5) <= pauVar74) break;
      uVar77 = uVar77 - wrk->x_sub;
      if ((int)uVar77 < 0) {
        iVar75 = iVar75 + -1;
        if (iVar75 == 0) {
          if (src + (long)iVar3 + -8 < puVar76) {
            pbVar1 = (byte *)((long)puVar76 + 1);
            puVar76 = (ulong *)((long)puVar76 + 1);
            uVar79 = auVar80._2_8_;
            auVar80._8_8_ = auVar80._8_8_ >> 0x10;
            auVar80._0_8_ = uVar79 & 0xffffffff0000ffff | (ulong)*pbVar1 << 0x10;
            iVar75 = 1;
          }
          else {
            uVar79 = *puVar76;
            auVar12._8_6_ = 0;
            auVar12._0_8_ = uVar79;
            auVar12[0xe] = (char)(uVar79 >> 0x38);
            auVar16._8_4_ = 0;
            auVar16._0_8_ = uVar79;
            auVar16[0xc] = (char)(uVar79 >> 0x30);
            auVar16._13_2_ = auVar12._13_2_;
            auVar20._8_4_ = 0;
            auVar20._0_8_ = uVar79;
            auVar20._12_3_ = auVar16._12_3_;
            auVar24._8_2_ = 0;
            auVar24._0_8_ = uVar79;
            auVar24[10] = (char)(uVar79 >> 0x28);
            auVar24._11_4_ = auVar20._11_4_;
            auVar28._8_2_ = 0;
            auVar28._0_8_ = uVar79;
            auVar28._10_5_ = auVar24._10_5_;
            auVar32[8] = (char)(uVar79 >> 0x20);
            auVar32._0_8_ = uVar79;
            auVar32._9_6_ = auVar28._9_6_;
            auVar65._7_8_ = 0;
            auVar65._0_7_ = auVar32._8_7_;
            auVar70._1_8_ = SUB158(auVar65 << 0x40,7);
            auVar70[0] = (char)(uVar79 >> 0x18);
            auVar70._9_6_ = 0;
            auVar71._1_10_ = SUB1510(auVar70 << 0x30,5);
            auVar71[0] = (char)(uVar79 >> 0x10);
            auVar71._11_4_ = 0;
            auVar40[2] = (char)(uVar79 >> 8);
            auVar40._0_2_ = (ushort)uVar79;
            auVar40._3_12_ = SUB1512(auVar71 << 0x20,3);
            auVar80._0_2_ = (ushort)uVar79 & 0xff;
            auVar80._2_13_ = auVar40._2_13_;
            auVar80[0xf] = 0;
            puVar76 = (ulong *)((long)puVar76 + 7);
            iVar75 = 7;
          }
        }
        else {
          auVar80 = auVar80 >> 0x10;
        }
        uVar77 = uVar77 + uVar2;
      }
    }
    return;
  }
  uVar79 = *(ulong *)src;
  uVar85 = (undefined1)(uVar79 >> 0x38);
  auVar9._8_6_ = 0;
  auVar9._0_8_ = uVar79;
  auVar9[0xe] = uVar85;
  uVar84 = (undefined1)(uVar79 >> 0x30);
  auVar13._8_4_ = 0;
  auVar13._0_8_ = uVar79;
  auVar13[0xc] = uVar84;
  auVar13._13_2_ = auVar9._13_2_;
  auVar17._8_4_ = 0;
  auVar17._0_8_ = uVar79;
  auVar17._12_3_ = auVar13._12_3_;
  bVar83 = (byte)(uVar79 >> 0x28);
  auVar21._8_2_ = 0;
  auVar21._0_8_ = uVar79;
  auVar21[10] = bVar83;
  auVar21._11_4_ = auVar17._11_4_;
  auVar25._8_2_ = 0;
  auVar25._0_8_ = uVar79;
  auVar25._10_5_ = auVar21._10_5_;
  auVar86[4] = (byte)(uVar79 >> 0x20);
  auVar29[8] = auVar86[4];
  auVar29._0_8_ = uVar79;
  auVar29._9_6_ = auVar25._9_6_;
  auVar43._7_8_ = 0;
  auVar43._0_7_ = auVar29._8_7_;
  uVar82 = (undefined1)(uVar79 >> 0x18);
  auVar44._8_7_ = 0;
  auVar44._0_8_ = SUB158(auVar43 << 0x40,7);
  auVar45._9_6_ = 0;
  auVar45._0_9_ = SUB159(auVar44 << 0x38,6);
  auVar46._10_5_ = 0;
  auVar46._0_10_ = SUB1510(auVar45 << 0x30,5);
  auVar47._11_4_ = 0;
  auVar47._0_11_ = SUB1511(auVar46 << 0x28,4);
  auVar48._12_3_ = 0;
  auVar48._0_12_ = SUB1512(auVar47 << 0x20,3);
  auVar41._13_2_ = 0;
  auVar41._0_13_ = SUB1513(auVar48 << 0x18,2);
  auVar41 = auVar41 << 0x10;
  auVar33[0xb] = 0;
  auVar33._0_11_ = auVar41._0_11_;
  auVar33[0xc] = uVar82;
  auVar34[10] = 0;
  auVar34._0_10_ = auVar41._0_10_;
  auVar34._11_2_ = auVar33._11_2_;
  auVar35[9] = 0;
  auVar35._0_9_ = auVar41._0_9_;
  auVar35._10_3_ = auVar34._10_3_;
  uVar72 = CONCAT41(auVar35._9_4_,(char)(uVar79 >> 0x10));
  auVar49._5_8_ = 0;
  auVar49._0_5_ = uVar72;
  auVar50._6_7_ = 0;
  auVar50._0_6_ = SUB136(auVar49 << 0x40,7);
  auVar51._7_6_ = 0;
  auVar51._0_7_ = SUB137(auVar50 << 0x38,6);
  Var52 = CONCAT81(SUB138(auVar51 << 0x30,5),(char)(uVar79 >> 8));
  auVar66._9_4_ = 0;
  auVar66._0_9_ = Var52;
  auVar53._10_3_ = 0;
  auVar53._0_10_ = SUB1310(auVar66 << 0x20,3);
  auVar88._0_2_ = (ushort)uVar79 & 0xff;
  auVar88._2_11_ = SUB1311(auVar53 << 0x18,2);
  auVar88._13_3_ = 0;
  auVar90._4_4_ = (int)Var52;
  auVar90._0_4_ = (int)uVar72;
  auVar90[8] = uVar82;
  auVar90._9_3_ = 0;
  auVar90[0xc] = uVar82;
  auVar90._13_3_ = 0;
  auVar86._1_3_ = 0;
  auVar86[0] = auVar86[4];
  auVar91._1_3_ = 0;
  auVar91[0] = bVar83;
  auVar91[4] = uVar84;
  auVar91._5_3_ = 0;
  auVar91[8] = uVar85;
  auVar91._9_3_ = 0;
  auVar91[0xc] = uVar85;
  auVar91._13_3_ = 0;
  auVar91 = auVar91 & _DAT_00123d50 | ~_DAT_00123d50 & auVar90;
  auVar86._5_3_ = 0;
  auVar86[8] = bVar83;
  auVar86._9_3_ = 0;
  auVar86[0xc] = uVar85;
  auVar86._13_3_ = 0;
  auVar94 = pshufhw(~_DAT_00123d50 & auVar90,auVar86,0xc4);
  auVar86 = pshuflw(auVar88,auVar88,0xec);
  auVar97._0_4_ = auVar86._0_4_;
  auVar97._12_4_ = auVar86._12_4_;
  auVar97._4_4_ = auVar97._12_4_;
  auVar97._8_4_ = auVar86._4_4_;
  auVar86 = auVar97 & _DAT_00123d60 | ~_DAT_00123d60 & auVar94;
  sVar6 = auVar86._0_2_;
  sVar7 = auVar86._2_2_;
  auVar94[1] = (0 < sVar7) * (sVar7 < 0x100) * auVar86[2] - (0xff < sVar7);
  auVar94[0] = (0 < sVar6) * (sVar6 < 0x100) * auVar86[0] - (0xff < sVar6);
  sVar6 = auVar86._4_2_;
  auVar94[2] = (0 < sVar6) * (sVar6 < 0x100) * auVar86[4] - (0xff < sVar6);
  sVar6 = auVar86._6_2_;
  auVar94[3] = (0 < sVar6) * (sVar6 < 0x100) * auVar86[6] - (0xff < sVar6);
  sVar6 = auVar86._8_2_;
  auVar94[4] = (0 < sVar6) * (sVar6 < 0x100) * auVar86[8] - (0xff < sVar6);
  sVar6 = auVar86._10_2_;
  auVar94[5] = (0 < sVar6) * (sVar6 < 0x100) * auVar86[10] - (0xff < sVar6);
  sVar6 = auVar86._12_2_;
  auVar94[6] = (0 < sVar6) * (sVar6 < 0x100) * auVar86[0xc] - (0xff < sVar6);
  sVar6 = auVar86._14_2_;
  auVar94[7] = (0 < sVar6) * (sVar6 < 0x100) * auVar86[0xe] - (0xff < sVar6);
  sVar6 = auVar91._0_2_;
  auVar94[8] = (0 < sVar6) * (sVar6 < 0x100) * auVar91[0] - (0xff < sVar6);
  sVar6 = auVar91._2_2_;
  auVar94[9] = (0 < sVar6) * (sVar6 < 0x100) * auVar91[2] - (0xff < sVar6);
  uVar8 = auVar91._4_2_;
  auVar94[10] = (uVar8 != 0) * (uVar8 < 0x100) * auVar91[4] - (0xff < uVar8);
  auVar94[0xb] = 0;
  sVar6 = auVar91._8_2_;
  auVar94[0xc] = (0 < sVar6) * (sVar6 < 0x100) * auVar91[8] - (0xff < sVar6);
  sVar6 = auVar91._10_2_;
  auVar94[0xd] = (0 < sVar6) * (sVar6 < 0x100) * auVar91[10] - (0xff < sVar6);
  sVar6 = auVar91._12_2_;
  auVar94[0xe] = (0 < sVar6) * (sVar6 < 0x100) * auVar91[0xc] - (0xff < sVar6);
  sVar6 = auVar91._14_2_;
  auVar94[0xf] = (0 < sVar6) * (sVar6 < 0x100) * auVar91[0xe] - (0xff < sVar6);
  uVar77 = uVar2;
  do {
    src = (uint8_t *)((long)src + 4);
    do {
      uVar78 = (uVar2 - uVar77) * 0x10000 | uVar77;
      auVar92._4_4_ = uVar78;
      auVar92._0_4_ = uVar78;
      auVar92._8_4_ = uVar78;
      auVar92._12_4_ = uVar78;
      auVar86 = pmaddwd(auVar92,auVar94);
      *pauVar74 = auVar86;
      pauVar74 = pauVar74 + 1;
      if ((undefined1 (*) [16])(prVar73 + (long)iVar4 * (long)iVar5) <= pauVar74) {
        return;
      }
      uVar77 = uVar77 - wrk->x_sub;
    } while (-1 < (int)uVar77);
    uVar79 = *(ulong *)src;
    uVar85 = (undefined1)(uVar79 >> 0x38);
    auVar10._8_6_ = 0;
    auVar10._0_8_ = uVar79;
    auVar10[0xe] = uVar85;
    uVar84 = (undefined1)(uVar79 >> 0x30);
    auVar14._8_4_ = 0;
    auVar14._0_8_ = uVar79;
    auVar14[0xc] = uVar84;
    auVar14._13_2_ = auVar10._13_2_;
    auVar18._8_4_ = 0;
    auVar18._0_8_ = uVar79;
    auVar18._12_3_ = auVar14._12_3_;
    bVar83 = (byte)(uVar79 >> 0x28);
    auVar22._8_2_ = 0;
    auVar22._0_8_ = uVar79;
    auVar22[10] = bVar83;
    auVar22._11_4_ = auVar18._11_4_;
    auVar26._8_2_ = 0;
    auVar26._0_8_ = uVar79;
    auVar26._10_5_ = auVar22._10_5_;
    auVar87[4] = (byte)(uVar79 >> 0x20);
    auVar30[8] = auVar87[4];
    auVar30._0_8_ = uVar79;
    auVar30._9_6_ = auVar26._9_6_;
    auVar54._7_8_ = 0;
    auVar54._0_7_ = auVar30._8_7_;
    uVar82 = (undefined1)(uVar79 >> 0x18);
    auVar55._8_7_ = 0;
    auVar55._0_8_ = SUB158(auVar54 << 0x40,7);
    auVar56._9_6_ = 0;
    auVar56._0_9_ = SUB159(auVar55 << 0x38,6);
    auVar57._10_5_ = 0;
    auVar57._0_10_ = SUB1510(auVar56 << 0x30,5);
    auVar58._11_4_ = 0;
    auVar58._0_11_ = SUB1511(auVar57 << 0x28,4);
    auVar59._12_3_ = 0;
    auVar59._0_12_ = SUB1512(auVar58 << 0x20,3);
    auVar42._13_2_ = 0;
    auVar42._0_13_ = SUB1513(auVar59 << 0x18,2);
    auVar42 = auVar42 << 0x10;
    auVar36[0xb] = 0;
    auVar36._0_11_ = auVar42._0_11_;
    auVar36[0xc] = uVar82;
    auVar37[10] = 0;
    auVar37._0_10_ = auVar42._0_10_;
    auVar37._11_2_ = auVar36._11_2_;
    auVar38[9] = 0;
    auVar38._0_9_ = auVar42._0_9_;
    auVar38._10_3_ = auVar37._10_3_;
    uVar72 = CONCAT41(auVar38._9_4_,(char)(uVar79 >> 0x10));
    auVar60._5_8_ = 0;
    auVar60._0_5_ = uVar72;
    auVar61._6_7_ = 0;
    auVar61._0_6_ = SUB136(auVar60 << 0x40,7);
    auVar62._7_6_ = 0;
    auVar62._0_7_ = SUB137(auVar61 << 0x38,6);
    Var52 = CONCAT81(SUB138(auVar62 << 0x30,5),(char)(uVar79 >> 8));
    auVar67._9_4_ = 0;
    auVar67._0_9_ = Var52;
    auVar63._10_3_ = 0;
    auVar63._0_10_ = SUB1310(auVar67 << 0x20,3);
    auVar93._0_2_ = (ushort)uVar79 & 0xff;
    auVar93._2_11_ = SUB1311(auVar63 << 0x18,2);
    auVar93._13_3_ = 0;
    auVar95._4_4_ = (int)Var52;
    auVar95._0_4_ = (int)uVar72;
    auVar95[8] = uVar82;
    auVar95._9_3_ = 0;
    auVar95[0xc] = uVar82;
    auVar95._13_3_ = 0;
    auVar87._1_3_ = 0;
    auVar87[0] = auVar87[4];
    auVar96._1_3_ = 0;
    auVar96[0] = bVar83;
    auVar96[4] = uVar84;
    auVar96._5_3_ = 0;
    auVar96[8] = uVar85;
    auVar96._9_3_ = 0;
    auVar96[0xc] = uVar85;
    auVar96._13_3_ = 0;
    auVar97 = auVar96 & auVar80 | ~auVar80 & auVar95;
    auVar87._5_3_ = 0;
    auVar87[8] = bVar83;
    auVar87._9_3_ = 0;
    auVar87[0xc] = uVar85;
    auVar87._13_3_ = 0;
    auVar86 = pshufhw(auVar87,auVar87,0xc4);
    auVar88 = pshuflw(auVar86,auVar93,0xec);
    auVar89._0_4_ = auVar88._0_4_;
    auVar89._12_4_ = auVar88._12_4_;
    auVar89._4_4_ = auVar89._12_4_;
    auVar89._8_4_ = auVar88._4_4_;
    auVar86 = auVar89 & auVar81 | ~auVar81 & auVar86;
    sVar6 = auVar86._0_2_;
    sVar7 = auVar86._2_2_;
    auVar94[1] = (0 < sVar7) * (sVar7 < 0x100) * auVar86[2] - (0xff < sVar7);
    auVar94[0] = (0 < sVar6) * (sVar6 < 0x100) * auVar86[0] - (0xff < sVar6);
    sVar6 = auVar86._4_2_;
    auVar94[2] = (0 < sVar6) * (sVar6 < 0x100) * auVar86[4] - (0xff < sVar6);
    sVar6 = auVar86._6_2_;
    auVar94[3] = (0 < sVar6) * (sVar6 < 0x100) * auVar86[6] - (0xff < sVar6);
    sVar6 = auVar86._8_2_;
    auVar94[4] = (0 < sVar6) * (sVar6 < 0x100) * auVar86[8] - (0xff < sVar6);
    sVar6 = auVar86._10_2_;
    auVar94[5] = (0 < sVar6) * (sVar6 < 0x100) * auVar86[10] - (0xff < sVar6);
    sVar6 = auVar86._12_2_;
    auVar94[6] = (0 < sVar6) * (sVar6 < 0x100) * auVar86[0xc] - (0xff < sVar6);
    sVar6 = auVar86._14_2_;
    auVar94[7] = (0 < sVar6) * (sVar6 < 0x100) * auVar86[0xe] - (0xff < sVar6);
    sVar6 = auVar97._0_2_;
    auVar94[8] = (0 < sVar6) * (sVar6 < 0x100) * auVar97[0] - (0xff < sVar6);
    sVar6 = auVar97._2_2_;
    auVar94[9] = (0 < sVar6) * (sVar6 < 0x100) * auVar97[2] - (0xff < sVar6);
    uVar8 = auVar97._4_2_;
    auVar94[10] = (uVar8 != 0) * (uVar8 < 0x100) * auVar97[4] - (0xff < uVar8);
    auVar94[0xb] = 0;
    sVar6 = auVar97._8_2_;
    auVar94[0xc] = (0 < sVar6) * (sVar6 < 0x100) * auVar97[8] - (0xff < sVar6);
    sVar6 = auVar97._10_2_;
    auVar94[0xd] = (0 < sVar6) * (sVar6 < 0x100) * auVar97[10] - (0xff < sVar6);
    sVar6 = auVar97._12_2_;
    auVar94[0xe] = (0 < sVar6) * (sVar6 < 0x100) * auVar97[0xc] - (0xff < sVar6);
    sVar6 = auVar97._14_2_;
    auVar94[0xf] = (0 < sVar6) * (sVar6 < 0x100) * auVar97[0xe] - (0xff < sVar6);
    uVar77 = uVar77 + uVar2;
  } while( true );
}

Assistant:

static void RescalerImportRowExpand_SSE2(WebPRescaler* WEBP_RESTRICT const wrk,
                                         const uint8_t* WEBP_RESTRICT src) {
  rescaler_t* frow = wrk->frow;
  const rescaler_t* const frow_end = frow + wrk->dst_width * wrk->num_channels;
  const int x_add = wrk->x_add;
  int accum = x_add;
  __m128i cur_pixels;

  // SSE2 implementation only works with 16b signed arithmetic at max.
  if (wrk->src_width < 8 || accum >= (1 << 15)) {
    WebPRescalerImportRowExpand_C(wrk, src);
    return;
  }

  assert(!WebPRescalerInputDone(wrk));
  assert(wrk->x_expand);
  if (wrk->num_channels == 4) {
    LoadTwoPixels_SSE2(src, &cur_pixels);
    src += 4;
    while (1) {
      const __m128i mult = _mm_set1_epi32(((x_add - accum) << 16) | accum);
      const __m128i out = _mm_madd_epi16(cur_pixels, mult);
      _mm_storeu_si128((__m128i*)frow, out);
      frow += 4;
      if (frow >= frow_end) break;
      accum -= wrk->x_sub;
      if (accum < 0) {
        LoadTwoPixels_SSE2(src, &cur_pixels);
        src += 4;
        accum += x_add;
      }
    }
  } else {
    int left;
    const uint8_t* const src_limit = src + wrk->src_width - 8;
    LoadEightPixels_SSE2(src, &cur_pixels);
    src += 7;
    left = 7;
    while (1) {
      const __m128i mult = _mm_cvtsi32_si128(((x_add - accum) << 16) | accum);
      const __m128i out = _mm_madd_epi16(cur_pixels, mult);
      assert(sizeof(*frow) == sizeof(uint32_t));
      WebPInt32ToMem((uint8_t*)frow, _mm_cvtsi128_si32(out));
      frow += 1;
      if (frow >= frow_end) break;
      accum -= wrk->x_sub;
      if (accum < 0) {
        if (--left) {
          cur_pixels = _mm_srli_si128(cur_pixels, 2);
        } else if (src <= src_limit) {
          LoadEightPixels_SSE2(src, &cur_pixels);
          src += 7;
          left = 7;
        } else {   // tail
          cur_pixels = _mm_srli_si128(cur_pixels, 2);
          cur_pixels = _mm_insert_epi16(cur_pixels, src[1], 1);
          src += 1;
          left = 1;
        }
        accum += x_add;
      }
    }
  }
  assert(accum == 0);
}